

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O1

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 void *src,size_t srcSize)

{
  rawSeq *prVar1;
  BYTE *pBVar2;
  seqDef *psVar3;
  uint uVar4;
  uint uVar5;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar6;
  undefined8 *puVar7;
  uint uVar8;
  BYTE *pBVar9;
  void *pvVar10;
  ulong uVar11;
  ZSTD_dictMode_e dictMode;
  U32 UVar12;
  ulong uVar14;
  ulong uVar15;
  U32 UVar13;
  
  dictMode = ZSTD_extDict;
  if ((ms->window).dictLimit <= (ms->window).lowLimit) {
    dictMode = (uint)(ms->dictMatchState != (ZSTD_matchState_t *)0x0) * 2;
  }
  uVar5 = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE = ZSTD_selectBlockCompressor((ms->cParams).strategy,dictMode);
  pvVar10 = (void *)(srcSize + (long)src);
  do {
    uVar14 = rawSeqStore->pos;
    if ((rawSeqStore->size <= uVar14) || (pvVar10 <= src)) break;
    prVar1 = rawSeqStore->seq + uVar14;
    uVar15._0_4_ = prVar1->offset;
    uVar15._4_4_ = prVar1->litLength;
    uVar11 = uVar15 >> 0x20;
    UVar12 = rawSeqStore->seq[uVar14].matchLength;
    uVar4 = (uint)((long)pvVar10 - (long)src);
    if (uVar4 < uVar15._4_4_ + UVar12) {
      uVar14 = uVar15;
      if (uVar4 - uVar15._4_4_ < uVar5) {
        uVar14 = 0;
      }
      UVar13 = uVar4 - uVar15._4_4_;
      if (uVar4 < (uint)uVar15._4_4_ || uVar4 - uVar15._4_4_ == 0) {
        uVar14 = 0;
        UVar13 = UVar12;
      }
      UVar12 = UVar13;
      ZSTD_ldm_skipSequences(rawSeqStore,(long)pvVar10 - (long)src & 0xffffffff,uVar5);
      uVar15 = uVar14;
    }
    else {
      rawSeqStore->pos = uVar14 + 1;
    }
    UVar13 = (U32)uVar15;
    if (UVar13 != 0) {
      uVar4 = (int)src - *(int *)&(ms->window).base;
      if (ms->nextToUpdate + 0x400 < uVar4) {
        uVar8 = (uVar4 - ms->nextToUpdate) - 0x400;
        if (0x1ff < uVar8) {
          uVar8 = 0x200;
        }
        ms->nextToUpdate = uVar4 - uVar8;
      }
      ZSTD_ldm_fillFastTables(ms,src);
      sVar6 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar11);
      *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
      *rep = UVar13;
      puVar7 = (undefined8 *)((long)src + (uVar11 - sVar6));
      pBVar9 = seqStore->lit;
      pBVar2 = pBVar9 + sVar6;
      do {
        *(undefined8 *)pBVar9 = *puVar7;
        pBVar9 = pBVar9 + 8;
        puVar7 = puVar7 + 1;
      } while (pBVar9 < pBVar2);
      seqStore->lit = seqStore->lit + sVar6;
      if (0xffff < sVar6) {
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
      psVar3 = seqStore->sequences;
      psVar3->litLength = (U16)sVar6;
      psVar3->offset = UVar13 + 3;
      if (0xffff < UVar12 - 3) {
        seqStore->longLengthID = 2;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar3 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar3->matchLength = (U16)(UVar12 - 3);
      seqStore->sequences = psVar3 + 1;
      src = (void *)((long)src + UVar12 + uVar11);
    }
  } while (UVar13 != 0);
  uVar5 = (int)src - *(int *)&(ms->window).base;
  if (ms->nextToUpdate + 0x400 < uVar5) {
    uVar4 = (uVar5 - ms->nextToUpdate) - 0x400;
    if (0x1ff < uVar4) {
      uVar4 = 0x200;
    }
    ms->nextToUpdate = uVar5 - uVar4;
  }
  ZSTD_ldm_fillFastTables(ms,src);
  sVar6 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,(long)pvVar10 - (long)src);
  return sVar6;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the lits */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(sequence.offset <= (1U << cParams->windowLog));
        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "calling block compressor on segment of size %u", sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}